

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O2

void __thiscall MyRTPSession::OnBYEPacket(MyRTPSession *this,RTPSourceData *dat)

{
  uint uVar1;
  RTPIPv4Address *addr;
  RTPAddress *pRVar2;
  ostream *poVar3;
  char *__s;
  ushort uVar4;
  RTPIPv4Address dest;
  allocator<char> local_51;
  string local_50 [32];
  RTPAddress local_30;
  ushort local_20;
  short local_1e;
  
  if (dat->ownssrc == false) {
    pRVar2 = dat->rtpaddr;
    if (pRVar2 == (RTPAddress *)0x0) {
      pRVar2 = dat->rtcpaddr;
      if (pRVar2 == (RTPAddress *)0x0) {
        return;
      }
      uVar4 = (short)*(undefined4 *)&pRVar2[1]._vptr_RTPAddress - 1;
    }
    else {
      uVar4 = *(ushort *)&pRVar2[1]._vptr_RTPAddress;
    }
    uVar1 = *(uint *)&pRVar2->field_0xc;
    local_30.addresstype = IPv4Address;
    local_30._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00144cf0;
    local_1e = uVar4 + 1;
    local_30._12_4_ = uVar1;
    local_20 = uVar4;
    jrtplib::RTPSession::DeleteDestination(&this->super_RTPSession,&local_30);
    poVar3 = std::operator<<((ostream *)&std::cout,"Deleting destination ");
    __s = inet_ntoa((in_addr)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18));
    std::__cxx11::string::string<std::allocator<char>>(local_50,__s,&local_51);
    poVar3 = std::operator<<(poVar3,local_50);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void OnBYEPacket(RTPSourceData *dat)
	{
		if (dat->IsOwnSSRC())
			return;
		
		uint32_t ip;
		uint16_t port;
		
		if (dat->GetRTPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort();
		}
		else if (dat->GetRTCPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTCPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort()-1;
		}
		else
			return;
		
		RTPIPv4Address dest(ip,port);
		DeleteDestination(dest);
		
		struct in_addr inaddr;
		inaddr.s_addr = htonl(ip);
		std::cout << "Deleting destination " << std::string(inet_ntoa(inaddr)) << ":" << port << std::endl;
	}